

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImVector<ImVec2> *this;
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 in_register_00001244 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImVec2 local_28;
  
  auVar6._4_60_ = in_register_00001244;
  auVar6._0_4_ = sz;
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = pos;
  auVar7._0_4_ = sz / 5.0;
  auVar7._4_12_ = in_register_00001244._0_12_;
  this = &draw_list->_Path;
  auVar7 = vmaxss_avx(auVar7,ZEXT416(0x3f800000));
  auVar3 = vfnmadd231ss_fma(auVar6._0_16_,auVar7,SUB6416(ZEXT464(0x3f000000),0));
  auVar8._0_4_ = auVar3._0_4_ / 3.0;
  auVar8._4_12_ = auVar3._4_12_;
  fVar2 = auVar7._0_4_ * 0.25;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  auVar1 = vfnmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar1._0_4_ + fVar2)),auVar8,
                            SUB6416(ZEXT464(0x3f000000),0));
  fVar2 = pos.x + fVar2 + auVar8._0_4_;
  local_28.x = fVar2 - auVar8._0_4_;
  fVar5 = auVar1._0_4_;
  local_28.y = fVar5 - auVar8._0_4_;
  ImVector<ImVec2>::push_back(this,&local_28);
  local_28.x = fVar2;
  local_28.y = fVar5;
  ImVector<ImVec2>::push_back(this,&local_28);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)auVar8._0_4_),
                           SUB6416(ZEXT464(0x40000000),0));
  auVar3 = vfnmadd231ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)auVar8._0_4_),
                            SUB6416(ZEXT464(0x40000000),0));
  local_28.x = auVar1._0_4_;
  local_28.y = auVar3._0_4_;
  ImVector<ImVec2>::push_back(this,&local_28);
  ImDrawList::PathStroke(draw_list,col,false,auVar7._0_4_);
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, false, thickness);
}